

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_flatten(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int map)

{
  JSValueUnion JVar1;
  JSValue mapperFunction;
  JSValue thisArg;
  int iVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  JSRefCountHeader *p;
  JSValue JVar9;
  JSValue JVar10;
  uint local_68;
  int64_t local_60;
  JSValueUnion local_58;
  int depthNum;
  int64_t local_48;
  ulong local_40;
  int64_t sourceLen;
  
  JVar9 = JS_ToObject(ctx,this_val);
  JVar3 = JVar9.u;
  iVar2 = js_get_length64(ctx,&sourceLen,JVar9);
  local_68 = (uint)JVar9.tag;
  if (iVar2 == 0) {
    depthNum = 1;
    if (map == 0) {
      if (argc < 1) {
        local_48 = 3;
        uVar7 = 0;
        pvVar6 = (void *)0x0;
        local_58.float64 = 0.0;
        local_60 = 3;
      }
      else {
        iVar4 = argv->tag;
        uVar5 = (uint)iVar4;
        if (uVar5 == 3) {
          local_48 = 3;
          uVar7 = 0;
          pvVar6 = (void *)0x0;
          local_58.float64 = 0.0;
          local_60 = 3;
        }
        else {
          JVar1 = (JSValueUnion)(argv->u).ptr;
          if (0xfffffff4 < uVar5) {
            *(int *)JVar1.ptr = *JVar1.ptr + 1;
          }
          JVar10.tag = iVar4;
          JVar10.u.ptr = JVar1.ptr;
          iVar2 = JS_ToInt32SatFree(ctx,&depthNum,JVar10);
          local_48 = 3;
          uVar7 = 0;
          pvVar6 = (void *)0x0;
          local_58.float64 = 0.0;
          local_60 = 3;
          JVar10 = (JSValue)(ZEXT816(3) << 0x40);
          uVar8 = 0;
          if (iVar2 < 0) goto LAB_00163b87;
        }
      }
    }
    else {
      pvVar6 = (argv->u).ptr;
      iVar4 = argv->tag;
      if (argc < 2) {
        local_58.float64 = 0.0;
        local_60 = 3;
      }
      else {
        local_58 = (JSValueUnion)argv[1].u.ptr;
        local_60 = argv[1].tag;
      }
      iVar2 = check_function(ctx,*argv);
      if (iVar2 != 0) {
        JVar10 = (JSValue)(ZEXT816(3) << 0x40);
        uVar8 = 0;
        goto LAB_00163b87;
      }
      uVar7 = (ulong)pvVar6 & 0xffffffff00000000;
      local_48 = iVar4;
    }
    local_40 = uVar7;
    JVar10 = JS_ArraySpeciesCreate(ctx,JVar9,(JSValue)ZEXT816(0));
    uVar8 = (ulong)JVar10.u.ptr >> 0x20;
    if (((int)JVar10.tag != 6) &&
       (mapperFunction.tag = local_48,
       mapperFunction.u.ptr = (void *)((ulong)pvVar6 & 0xffffffff | local_40),
       thisArg.tag = local_60, thisArg.u.float64 = local_58.float64,
       iVar4 = JS_FlattenIntoArray(ctx,JVar10,JVar9,sourceLen,0,depthNum,mapperFunction,thisArg),
       -1 < iVar4)) {
      if (local_68 < 0xfffffff5) {
        return JVar10;
      }
      iVar2 = *JVar3.ptr;
      *(int *)JVar3.ptr = iVar2 + -1;
      if (1 < iVar2) {
        return JVar10;
      }
      __JS_FreeValueRT(ctx->rt,JVar9);
      return JVar10;
    }
  }
  else {
    JVar10 = (JSValue)(ZEXT816(3) << 0x40);
    uVar8 = 0;
  }
LAB_00163b87:
  if ((0xfffffff4 < local_68) && (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar9);
  }
  if (0xfffffff4 < (uint)JVar10.tag) {
    JVar9.u.ptr = (void *)((ulong)JVar10.u.ptr & 0xffffffff | uVar8 << 0x20);
    iVar2 = *JVar9.u.ptr;
    *(int *)JVar9.u.ptr = iVar2 + -1;
    if (iVar2 < 2) {
      JVar9.tag = JVar10.tag;
      __JS_FreeValueRT(ctx->rt,JVar9);
    }
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_array_flatten(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv, int map)
{
    JSValue obj, arr;
    JSValueConst mapperFunction, thisArg;
    int64_t sourceLen;
    int depthNum;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &sourceLen, obj))
        goto exception;

    depthNum = 1;
    mapperFunction = JS_UNDEFINED;
    thisArg = JS_UNDEFINED;
    if (map) {
        mapperFunction = argv[0];
        if (argc > 1) {
            thisArg = argv[1];
        }
        if (check_function(ctx, mapperFunction))
            goto exception;
    } else {
        if (argc > 0 && !JS_IsUndefined(argv[0])) {
            if (JS_ToInt32Sat(ctx, &depthNum, argv[0]) < 0)
                goto exception;
        }
    }
    arr = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
    if (JS_IsException(arr))
        goto exception;
    if (JS_FlattenIntoArray(ctx, arr, obj, sourceLen, 0, depthNum,
                            mapperFunction, thisArg) < 0)
        goto exception;
    JS_FreeValue(ctx, obj);
    return arr;

exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}